

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  uint uVar1;
  uint uVar2;
  quint32 qVar3;
  uchar *puVar4;
  FetchAndConvertPixelsFunc p_Var5;
  QList<unsigned_int> *pQVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint *puVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  long in_FS_OFFSET;
  IntermediateBuffer intermediate;
  IntermediateBuffer local_4048;
  long local_38;
  
  bVar8 = (byte)((ulong)fy >> 8);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar16 = (int)fy >> 0x10;
  iVar20 = image->y1;
  iVar19 = image->y2 + -1;
  iVar15 = iVar19;
  if (iVar16 < iVar19) {
    iVar19 = iVar16;
    iVar15 = iVar16 + 1;
  }
  if (iVar16 < iVar20) {
    iVar15 = iVar20;
    iVar19 = iVar20;
  }
  puVar4 = image->imageData;
  lVar17 = image->bytesPerLine;
  iVar16 = (int)((ulong)((long)end - (long)b) >> 2);
  iVar24 = 0x100 - (uint)bVar8;
  iVar20 = (fdx >> 0x1f & iVar16 * fdx) + *fx >> 0x10;
  uVar10 = -fdx;
  if (0 < fdx) {
    uVar10 = fdx;
  }
  lVar13 = (ulong)uVar10 * (long)iVar16;
  lVar14 = lVar13 + 0xffff;
  lVar13 = lVar13 + 0x1fffe;
  if (-1 < lVar14) {
    lVar13 = lVar14;
  }
  iVar16 = image->x1;
  iVar7 = iVar16;
  if (iVar16 < iVar20) {
    iVar7 = iVar20;
  }
  iVar9 = (int)((ulong)lVar13 >> 0x10);
  iVar18 = iVar20 + 2 + iVar9;
  iVar22 = image->x2;
  if (iVar18 < image->x2) {
    iVar22 = iVar18;
  }
  p_Var5 = qPixelLayouts[image->format].fetchToARGB32PM;
  uVar23 = 1;
  if (1 < iVar22 - iVar7) {
    uVar23 = (ulong)(uint)(iVar22 - iVar7);
  }
  pQVar6 = image->colorTable;
  iVar9 = iVar9 + 2;
  uVar10 = iVar7 - iVar20;
  uVar21 = 0;
  iVar22 = (int)uVar23;
  puVar11 = (*p_Var5)(local_4048.buffer_rb + (int)uVar10,puVar4 + iVar19 * lVar17,iVar7,iVar22,
                      pQVar6,(QDitherInfo *)0x0);
  puVar12 = (*p_Var5)(local_4048.buffer_ag + (int)uVar10,puVar4 + iVar15 * lVar17,iVar7,iVar22,
                      pQVar6,(QDitherInfo *)0x0);
  lVar14 = (long)iVar20;
  lVar17 = (long)iVar16;
  if (iVar16 <= lVar14) {
    lVar17 = lVar14;
  }
  lVar17 = lVar17 * 4 + lVar14 * -4;
  do {
    uVar1 = puVar11[uVar21];
    uVar2 = puVar12[uVar21];
    *(uint *)((long)&local_4048 + uVar21 * 4 + lVar17) =
         (uVar2 & 0xff00ff) * (uint)bVar8 + (uVar1 & 0xff00ff) * iVar24 >> 8 & 0xff00ff;
    *(uint *)((long)&local_4048 + uVar21 * 4 + lVar17 + 0x2008) =
         (uVar2 >> 8 & 0xff00ff) * (uint)bVar8 + (uVar1 >> 8 & 0xff00ff) * iVar24 >> 8 & 0xff00ff;
    uVar21 = uVar21 + 1;
  } while (uVar23 != uVar21);
  if (0 < (int)uVar10) {
    uVar23 = 0;
    do {
      local_4048.buffer_rb[uVar23] = local_4048.buffer_rb[(int)uVar10];
      local_4048.buffer_ag[uVar23] = local_4048.buffer_ag[(int)uVar10];
      uVar23 = uVar23 + 1;
    } while (uVar10 != uVar23);
  }
  if ((int)(iVar22 + uVar10) < iVar9) {
    lVar17 = (long)(int)(iVar22 + uVar10);
    qVar3 = local_4048.buffer_ag[lVar17 + -1];
    do {
      local_4048.buffer_rb[lVar17] = local_4048.buffer_rb[lVar17 + -1];
      local_4048.buffer_ag[lVar17] = qVar3;
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar9);
  }
  intermediate_adder(b,end,&local_4048,iVar20,fx,fdx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_simple_scale_helper(uint *b, uint *end, const QTextureData &image,
                                                                     int &fx, int &fy, int fdx, int /*fdy*/)
{
    const QPixelLayout *layout = &qPixelLayouts[image.format];
    const QList<QRgb> *clut = image.colorTable;
    const FetchAndConvertPixelsFunc fetch = layout->fetchToARGB32PM;

    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uchar *s1 = image.scanLine(y1);
    const uchar *s2 = image.scanLine(y2);

    const int disty = (fy & 0x0000ffff) >> 8;
    const int idisty = 256 - disty;
    const int length = end - b;

    // The intermediate buffer is generated in the positive direction
    const int adjust = (fdx < 0) ? fdx * length : 0;
    const int offset = (fx + adjust) >> 16;
    int x = offset;

    Q_DECL_UNINITIALIZED IntermediateBuffer intermediate;
    uint *buf1 = intermediate.buffer_rb;
    uint *buf2 = intermediate.buffer_ag;
    const uint *ptr1;
    const uint *ptr2;

    int count = (qint64(length) * qAbs(fdx) + fixed_scale - 1) / fixed_scale + 2;
    Q_ASSERT(count <= BufferSize + 2);

    if (blendType == BlendTransformedBilinearTiled) {
        x %= image.width;
        if (x < 0)
            x += image.width;
        int len1 = qMin(count, image.width - x);
        int len2 = qMin(x, count - len1);

        ptr1 = fetch(buf1, s1, x, len1, clut, nullptr);
        ptr2 = fetch(buf2, s2, x, len1, clut, nullptr);
        for (int i = 0; i < len1; ++i) {
            uint t = ptr1[i];
            uint b = ptr2[i];
            buf1[i] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            buf2[i] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        }

        if (len2) {
            ptr1 = fetch(buf1 + len1, s1, 0, len2, clut, nullptr);
            ptr2 = fetch(buf2 + len1, s2, 0, len2, clut, nullptr);
            for (int i = 0; i < len2; ++i) {
                uint t = ptr1[i];
                uint b = ptr2[i];
                buf1[i + len1] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
                buf2[i + len1] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
            }
        }
        // Generate the rest by repeatedly repeating the previous set of pixels
        for (int i = image.width; i < count; ++i) {
            buf1[i] = buf1[i - image.width];
            buf2[i] = buf2[i - image.width];
        }
    } else {
        int start = qMax(x, image.x1);
        int end = qMin(x + count, image.x2);
        int len = qMax(1, end - start);
        int leading = start - x;

        ptr1 = fetch(buf1 + leading, s1, start, len, clut, nullptr);
        ptr2 = fetch(buf2 + leading, s2, start, len, clut, nullptr);

        for (int i = 0; i < len; ++i) {
            uint t = ptr1[i];
            uint b = ptr2[i];
            buf1[i + leading] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            buf2[i + leading] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        }

        for (int i = 0; i < leading; ++i) {
            buf1[i] = buf1[leading];
            buf2[i] = buf2[leading];
        }
        for (int i = leading + len; i < count; ++i) {
            buf1[i] = buf1[i - 1];
            buf2[i] = buf2[i - 1];
        }
    }

    // Now interpolate the values from the intermediate.buffer to get the final result.
    intermediate_adder(b, end, intermediate, offset, fx, fdx);
}